

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

Data * __thiscall Runtime::getVar(Runtime *this,string *name)

{
  Data *result;
  Data *pDVar1;
  
  do {
    this = *(Runtime **)this;
    pDVar1 = (Data *)0x0;
    while( true ) {
      if (pDVar1 != (Data *)0x0) {
        return pDVar1;
      }
      if (*(VarEnv **)((long)this + 8) == (VarEnv *)0x0) break;
      pDVar1 = VarEnv::getVar(*(VarEnv **)((long)this + 8),name);
    }
  } while( true );
}

Assistant:

Data *Runtime::getVar(std::string &name) {
    auto cursor = varEnvs.begin();
    Data *result = NULL;
    while (result == NULL) {
        if ((*cursor) == NULL) {
            cursor++;
        } else {
            result = (*cursor)->getVar(name);
        }
    }
    return result;
}